

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::changeRowDualLower(HPresolve *this,HighsInt row,double newLower)

{
  bool bVar1;
  reference pvVar2;
  reference this_00;
  char *pcVar3;
  int __c;
  int __c_00;
  int in_ESI;
  iterator *rhs;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_01;
  HPresolve *in_XMM0_Qa;
  HPresolve *this_02;
  HighsSliceNonzero *nonzero;
  iterator __end1;
  iterator __begin1;
  HighsTripletTreeSlicePreOrder *__range1;
  double oldLower;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int col;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *in_stack_fffffffffffffed8;
  double in_stack_ffffffffffffff28;
  HighsInt *in_stack_ffffffffffffff30;
  HighsInt in_stack_ffffffffffffff38;
  HighsInt in_stack_ffffffffffffff3c;
  HighsLinearSumBounds *in_stack_ffffffffffffff40;
  iterator local_90;
  undefined1 local_50 [40];
  undefined1 *local_28;
  value_type local_20;
  HPresolve *local_18;
  int local_c;
  
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f0);
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)in_ESI);
  local_20 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_c);
  *pvVar2 = (value_type)local_18;
  getRowVector(local_18,(HighsInt)((ulong)this_01 >> 0x20));
  local_28 = local_50;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(in_stack_fffffffffffffed8);
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::end
            ((HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  while( true ) {
    rhs = (iterator *)&stack0xffffffffffffff30;
    bVar1 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator!=(&local_90,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator*(&local_90);
    pcVar3 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    col = local_c;
    this_02 = (HPresolve *)HighsSliceNonzero::value(this_00);
    pcVar3 = (char *)((ulong)pcVar3 & 0xffffffff);
    HighsLinearSumBounds::updatedVarLower
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    HighsSliceNonzero::index(this_00,pcVar3,__c_00);
    markChangedCol(this_02,col);
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++((iterator *)this_02);
  }
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x6ec73f);
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::~iterator((iterator *)0x6ec74c);
  return;
}

Assistant:

void HPresolve::changeRowDualLower(HighsInt row, double newLower) {
  double oldLower = rowDualLower[row];
  rowDualLower[row] = newLower;
  // printf("tightening lower bound of column %" HIGHSINT_FORMAT " from %.15g to
  // %.15g\n", col,
  //        oldLower, newLower);

  for (const HighsSliceNonzero& nonzero : getRowVector(row)) {
    impliedDualRowBounds.updatedVarLower(nonzero.index(), row, nonzero.value(),
                                         oldLower);
    markChangedCol(nonzero.index());
  }
}